

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O2

void __thiscall icu_63::number::impl::DecimalQuantity::switchStorage(DecimalQuantity *this)

{
  int8_t *buffer;
  int i;
  ulong uVar1;
  long lVar2;
  uint64_t uVar3;
  
  if (this->usingBytes == true) {
    buffer = (this->fBCD).bcdBytes.ptr;
    uVar3 = 0;
    for (uVar1 = (ulong)(uint)this->precision; 0 < (int)uVar1; uVar1 = uVar1 - 1) {
      uVar3 = uVar3 << 4 | (long)buffer[uVar1 - 1];
    }
    uprv_free_63(buffer);
    (this->fBCD).bcdLong = uVar3;
    this->usingBytes = false;
  }
  else {
    uVar3 = (this->fBCD).bcdLong;
    ensureCapacity(this);
    for (lVar2 = 0; lVar2 < this->precision; lVar2 = lVar2 + 1) {
      (this->fBCD).bcdBytes.ptr[lVar2] = (byte)uVar3 & 0xf;
      uVar3 = uVar3 >> 4;
    }
  }
  return;
}

Assistant:

void DecimalQuantity::switchStorage() {
    if (usingBytes) {
        // Change from bytes to long
        uint64_t bcdLong = 0L;
        for (int i = precision - 1; i >= 0; i--) {
            bcdLong <<= 4;
            bcdLong |= fBCD.bcdBytes.ptr[i];
        }
        uprv_free(fBCD.bcdBytes.ptr);
        fBCD.bcdBytes.ptr = nullptr;
        fBCD.bcdLong = bcdLong;
        usingBytes = false;
    } else {
        // Change from long to bytes
        // Copy the long into a local variable since it will get munged when we allocate the bytes
        uint64_t bcdLong = fBCD.bcdLong;
        ensureCapacity();
        for (int i = 0; i < precision; i++) {
            fBCD.bcdBytes.ptr[i] = static_cast<int8_t>(bcdLong & 0xf);
            bcdLong >>= 4;
        }
        U_ASSERT(usingBytes);
    }
}